

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::reducev
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  ushort *puVar1;
  float *pfVar2;
  uint16_t uVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  switch(dt) {
  case dt_uint8:
    if (vw * sstride != 0) {
      pbVar4 = (byte *)((long)(vw * sstride) + (long)src);
      iVar7 = nchan * uw;
      do {
        lVar8 = (long)iVar7;
        if (iVar7 != 0) {
          do {
            *(char *)dst = (char)((uint)*(byte *)((long)src + (long)sstride) + (uint)*src >> 1);
            dst = (void *)((long)dst + 1);
            src = (void *)((long)src + 1);
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        dst = (void *)((long)dst + (long)(dstride - iVar7));
        src = (void *)((long)src + (long)(sstride * 2 - iVar7));
      } while ((byte *)src != pbVar4);
    }
    break;
  case dt_uint16:
    iVar7 = sstride / 2;
    if (vw * iVar7 != 0) {
      puVar1 = (ushort *)((long)src + (long)(vw * iVar7) * 2);
      iVar5 = nchan * uw;
      do {
        lVar8 = (long)iVar5 * 2;
        if (iVar5 != 0) {
          do {
            *(short *)dst =
                 (short)((uint)*(ushort *)((long)src + (long)iVar7 * 2) + (uint)*src >> 1);
            dst = (void *)((long)dst + 2);
            src = (void *)((long)src + 2);
            lVar8 = lVar8 + -2;
          } while (lVar8 != 0);
        }
        src = (void *)((long)src + (long)(iVar7 * 2 - iVar5) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar5) * 2);
      } while ((ushort *)src != puVar1);
    }
    break;
  case dt_half:
    iVar7 = sstride / 2;
    if (vw * iVar7 != 0) {
      puVar1 = (ushort *)((long)src + (long)(vw * iVar7) * 2);
      iVar5 = nchan * uw;
      do {
        lVar8 = (long)iVar5 * 2;
        if (iVar5 != 0) {
          do {
            uVar3 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable + (ulong)*src * 4) +
                                        *(float *)(PtexHalf::h2fTable +
                                                  (ulong)*(ushort *)((long)src + (long)iVar7 * 2) *
                                                  4)) * 0.5);
            *(uint16_t *)dst = uVar3;
            dst = (void *)((long)dst + 2);
            src = (void *)((long)src + 2);
            lVar8 = lVar8 + -2;
          } while (lVar8 != 0);
        }
        src = (void *)((long)src + (long)(iVar7 * 2 - iVar5) * 2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar5) * 2);
      } while ((ushort *)src != puVar1);
    }
    break;
  case dt_float:
    iVar7 = sstride + 3;
    if (-1 < sstride) {
      iVar7 = sstride;
    }
    iVar7 = iVar7 >> 2;
    if (vw * iVar7 != 0) {
      iVar5 = dstride + 3;
      if (-1 < dstride) {
        iVar5 = dstride;
      }
      pfVar2 = (float *)((long)src + (long)(vw * iVar7) * 4);
      iVar6 = nchan * uw;
      do {
        lVar8 = (long)iVar6 << 2;
        if (iVar6 != 0) {
          do {
            *(float *)dst = (*src + *(float *)((long)src + (long)iVar7 * 4)) * 0.5;
            dst = (void *)((long)dst + 4);
            src = (void *)((long)src + 4);
            lVar8 = lVar8 + -4;
          } while (lVar8 != 0);
        }
        src = (void *)((long)src + (long)(iVar7 * 2 - iVar6) * 4);
        dst = (void *)((long)dst + (long)((iVar5 >> 2) - iVar6) * 4);
      } while ((float *)src != pfVar2);
    }
  }
  return;
}

Assistant:

void reducev(const void* src, int sstride, int uw, int vw,
             void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reducev(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reducev(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reducev(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reducev(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), dstride, nchan); break;
    }
}